

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acftest.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  double *vec;
  double *par;
  long lVar3;
  ulong uVar4;
  undefined1 local_25b8 [8];
  double temp [1200];
  
  __stream = fopen("../data/seriesC.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      iVar1 = 0;
      uVar4 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf \n",local_25b8 + uVar4);
        iVar2 = feof(__stream);
        uVar4 = uVar4 + 8;
        iVar1 = iVar1 + 1;
      } while (iVar2 == 0);
      vec = (double *)malloc(uVar4 & 0x7fffffff8);
      memcpy(vec,local_25b8,uVar4 & 0x7fffffff8);
    }
    else {
      iVar1 = 0;
      vec = (double *)malloc(0);
    }
    par = (double *)malloc(0x50);
    puts("\n Default Method : acvf ");
    acvf(vec,iVar1,par,10);
    lVar3 = 0;
    do {
      printf("%g ",par[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    putchar(10);
    puts("\n acvf_opt Method 0 General Method ");
    lVar3 = 0;
    acvf_opt(vec,iVar1,0,par,10);
    do {
      printf("%g ",par[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    putchar(10);
    puts("\n acvf_opt Method 1 FFT ");
    acvf_opt(vec,iVar1,1,par,10);
    lVar3 = 0;
    do {
      printf("%g ",par[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    puts("\n ");
    puts("Autocorrelation ");
    acvf2acf(par,10);
    lVar3 = 0;
    do {
      printf("%g ",par[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    putchar(10);
    free(vec);
    free(par);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, M;
	double *inp, *acf;
	int method;

	/*
	acvf and acvf_opt functions will calculate autocovariance from lag 0 to lag M-1
	*/

	FILE *ifp;
	double temp[1200];

	ifp = fopen("../data/seriesC.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}

	M = 10;
	acf = (double*)malloc(sizeof(double)* M);

	// Default Method

	printf("\n Default Method : acvf \n");

	acvf(inp, N, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n");

	// acvf_opt : Method 0 General Method
	method = 0;
	printf("\n acvf_opt Method 0 General Method \n");
	acvf_opt(inp, N, method, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}

	printf("\n");
	// acvf_opt : Method 1 FFT
	method = 1;
	printf("\n acvf_opt Method 1 FFT \n");
	acvf_opt(inp, N, method, acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n \n");

	// Calculate Autocorrelation from already caluclated Covariance function
	printf("Autocorrelation \n");
	acvf2acf(acf, M);

	for (i = 0; i < M; ++i) {
		printf("%g ", acf[i]);
	}
	printf("\n");

	free(inp);
	free(acf);
	return 0;

}